

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QtGraphicsAnchorLayout::ParallelAnchorData::updateChildrenSizes(ParallelAnchorData *this)

{
  bool bVar1;
  ParallelAnchorData *in_RDI;
  
  in_RDI->firstEdge->sizeAtMinimum = (in_RDI->super_AnchorData).sizeAtMinimum;
  in_RDI->firstEdge->sizeAtPreferred = (in_RDI->super_AnchorData).sizeAtPreferred;
  in_RDI->firstEdge->sizeAtMaximum = (in_RDI->super_AnchorData).sizeAtMaximum;
  bVar1 = secondForward(in_RDI);
  if (bVar1) {
    in_RDI->secondEdge->sizeAtMinimum = (in_RDI->super_AnchorData).sizeAtMinimum;
    in_RDI->secondEdge->sizeAtPreferred = (in_RDI->super_AnchorData).sizeAtPreferred;
    in_RDI->secondEdge->sizeAtMaximum = (in_RDI->super_AnchorData).sizeAtMaximum;
  }
  else {
    in_RDI->secondEdge->sizeAtMinimum = -(in_RDI->super_AnchorData).sizeAtMinimum;
    in_RDI->secondEdge->sizeAtPreferred = -(in_RDI->super_AnchorData).sizeAtPreferred;
    in_RDI->secondEdge->sizeAtMaximum = -(in_RDI->super_AnchorData).sizeAtMaximum;
  }
  (*in_RDI->firstEdge->_vptr_AnchorData[2])();
  (*in_RDI->secondEdge->_vptr_AnchorData[2])();
  return;
}

Assistant:

void ParallelAnchorData::updateChildrenSizes()
{
    firstEdge->sizeAtMinimum = sizeAtMinimum;
    firstEdge->sizeAtPreferred = sizeAtPreferred;
    firstEdge->sizeAtMaximum = sizeAtMaximum;

    if (secondForward()) {
        secondEdge->sizeAtMinimum = sizeAtMinimum;
        secondEdge->sizeAtPreferred = sizeAtPreferred;
        secondEdge->sizeAtMaximum = sizeAtMaximum;
    } else {
        secondEdge->sizeAtMinimum = -sizeAtMinimum;
        secondEdge->sizeAtPreferred = -sizeAtPreferred;
        secondEdge->sizeAtMaximum = -sizeAtMaximum;
    }

    firstEdge->updateChildrenSizes();
    secondEdge->updateChildrenSizes();
}